

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O1

void EBPLM::PredictStateOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *wmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  BCRec *bcrec;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  long lVar39;
  double *pdVar40;
  double *pdVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  EBCellFlag *pEVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  double *pdVar67;
  long lVar68;
  long lVar69;
  undefined8 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  int iVar83;
  undefined1 auVar84 [16];
  char cVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  pair<bool,_bool> pVar88;
  int kk;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  double *pdVar110;
  Long *pLVar111;
  int iVar112;
  int iVar113;
  uint uVar114;
  int iVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  int iVar122;
  int iVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  int iVar141;
  long lVar142;
  int iVar143;
  int iVar144;
  long lVar145;
  double *pdVar146;
  uint uVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  double *pdVar151;
  char cVar152;
  uint uVar153;
  int iVar154;
  uint uVar155;
  long lVar156;
  long lVar157;
  long lVar158;
  long lVar159;
  long lVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  double **ppdVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  double *pdVar169;
  double *pdVar170;
  long lVar171;
  long lVar172;
  int iVar173;
  int iVar174;
  long lVar175;
  int iVar176;
  long lVar177;
  double *pdVar178;
  double *pdVar179;
  int iVar180;
  long lVar181;
  int ii;
  int iVar182;
  bool bVar183;
  ulong uVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  undefined1 auVar193 [16];
  ulong uVar194;
  double dVar195;
  double dVar196;
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  Real delta_z;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  undefined1 auVar214 [16];
  Real delta_x;
  Real delta_y;
  Real A [27] [3];
  Real du [27];
  double local_ae8;
  double local_ab8;
  long local_aa0;
  double local_a28;
  double local_9e8;
  ulong local_938;
  long local_930;
  double *local_928;
  long local_920;
  double *local_918;
  double *local_888;
  double *local_860;
  double *local_858;
  double *local_850;
  double *local_830;
  double *local_828;
  double *local_820;
  double *local_7a8;
  double *local_7a0;
  double *local_798;
  long local_778;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  anon_class_688_19_da5fa63c local_3b8;
  double adStack_108 [27];
  
  dVar185 = dt / (geom->super_CoordSys).dx[1];
  iVar182 = (geom->domain).smallend.vect[0];
  iVar173 = (geom->domain).smallend.vect[1];
  iVar176 = (geom->domain).bigend.vect[0];
  iVar6 = (geom->domain).bigend.vect[1];
  iVar7 = (geom->domain).smallend.vect[2];
  iVar8 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar86 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,0);
  pVar87 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,1);
  pVar88 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,2);
  auVar84 = _DAT_006979c0;
  if (((((((ushort)pVar86 & 1) == 0) || (iVar182 < (zebox->smallend).vect[0] + -1)) &&
       ((((ushort)pVar86 >> 8 & 1) == 0 || ((zebox->bigend).vect[0] < iVar176)))) &&
      (((((ushort)pVar88 & 1) == 0 || (iVar7 < (zebox->smallend).vect[2] + -1)) &&
       ((((ushort)pVar88 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar8)))))) &&
     (((((ushort)pVar87 & 1) == 0 || (iVar173 < (zebox->smallend).vect[1] + -1)) &&
      ((((ushort)pVar87 >> 8 & 1) == 0 || ((zebox->bigend).vect[1] < iVar6)))))) {
    if (0 < ncomp) {
      iVar182 = (ccc->begin).y;
      iVar173 = (zebox->smallend).vect[1];
      lVar148 = (long)iVar173;
      lVar33 = ccc->jstride;
      lVar93 = ((lVar148 - iVar182) + -1) * lVar33;
      iVar176 = (ccc->begin).z;
      iVar6 = (zebox->smallend).vect[2];
      lVar166 = (long)iVar6;
      lVar34 = ccc->kstride;
      lVar116 = (~(long)iVar176 + lVar166) * lVar34;
      lVar35 = ccc->nstride;
      iVar7 = (zebox->smallend).vect[0];
      lVar181 = (long)iVar7;
      iVar8 = (ccc->begin).x;
      lVar94 = (long)iVar8;
      iVar9 = (q->begin).x;
      lVar175 = (long)iVar9;
      iVar10 = (q->begin).y;
      lVar145 = (long)iVar10;
      lVar36 = q->jstride;
      iVar11 = (q->begin).z;
      lVar149 = (long)iVar11;
      lVar37 = q->kstride;
      pdVar38 = q->p;
      lVar39 = q->nstride;
      pdVar40 = ccc->p;
      pdVar41 = fcz->p;
      lVar42 = fcz->jstride;
      lVar43 = fcz->kstride;
      lVar44 = fcz->nstride;
      iVar12 = (fcz->begin).z;
      iVar13 = (fcz->begin).y;
      lVar158 = (long)(fcz->begin).x;
      pdVar45 = fcy->p;
      lVar46 = fcy->jstride;
      lVar47 = fcy->kstride;
      lVar48 = fcy->nstride;
      iVar14 = (fcy->begin).y;
      lVar159 = (long)(fcy->begin).z;
      lVar160 = (long)(fcy->begin).x;
      pdVar49 = fcx->p;
      lVar50 = fcx->jstride;
      lVar51 = fcx->kstride;
      lVar52 = fcx->nstride;
      lVar161 = (long)(fcx->begin).z;
      iVar141 = (fcx->begin).y;
      iVar15 = (fcx->begin).x;
      pdVar53 = vfrac->p;
      lVar54 = vfrac->jstride;
      lVar55 = vfrac->kstride;
      uVar16 = (vfrac->begin).y;
      lVar162 = (long)(int)uVar16;
      iVar17 = (vfrac->begin).z;
      lVar171 = (long)iVar17;
      uVar18 = (vfrac->begin).x;
      lVar172 = (long)(int)uVar18;
      pEVar56 = flag->p;
      lVar57 = flag->jstride;
      lVar58 = flag->kstride;
      lVar167 = (long)(flag->begin).z;
      iVar19 = (flag->begin).y;
      iVar20 = (flag->begin).x;
      pdVar59 = Ipz->p;
      lVar60 = Ipz->jstride;
      lVar61 = Ipz->kstride;
      lVar62 = Ipz->nstride;
      uVar21 = (Ipz->begin).z;
      iVar22 = (Ipz->begin).y;
      iVar23 = (Ipz->begin).x;
      pdVar63 = Imz->p;
      lVar64 = Imz->jstride;
      lVar65 = Imz->kstride;
      lVar66 = Imz->nstride;
      iVar24 = (Imz->begin).z;
      iVar25 = (Imz->begin).y;
      iVar26 = (Imz->begin).x;
      pdVar67 = wmac->p;
      lVar68 = wmac->jstride;
      lVar69 = wmac->kstride;
      iVar27 = (wmac->begin).z;
      iVar28 = (wmac->begin).y;
      lVar177 = (long)(wmac->begin).x;
      iVar29 = (zebox->bigend).vect[2];
      iVar30 = (zebox->bigend).vect[0];
      iVar31 = (zebox->bigend).vect[1];
      uVar153 = (iVar7 + -1) - iVar9;
      local_888 = pdVar38 + ((lVar181 +
                             ((lVar148 - lVar145) + -1) * lVar36 +
                             ((lVar166 - lVar149) + -2) * lVar37) - lVar175);
      local_938 = 0;
      auVar214 = _DAT_006979b0;
      do {
        if (iVar6 <= iVar29) {
          lVar117 = local_938 * lVar39;
          local_928 = local_888;
          local_930 = lVar166;
          local_860 = pdVar40 + ((lVar181 + lVar93 + lVar116 + lVar35 * 2 + -1) - lVar94);
          local_858 = pdVar40 + ((lVar35 + lVar181 + lVar93 + lVar116 + -1) - lVar94);
          local_850 = pdVar40 + ((lVar181 + lVar93 + lVar116 + -1) - lVar94);
          do {
            if (iVar173 <= iVar31) {
              lVar2 = local_930 + -1;
              lVar3 = local_930 + -2;
              lVar4 = local_930 + 1;
              lVar124 = (local_930 - lVar171) * lVar55;
              lVar125 = (lVar2 - lVar171) * lVar55;
              lVar126 = (lVar3 - lVar171) * lVar55;
              lVar127 = (lVar4 - lVar171) * lVar55;
              lVar128 = (local_930 - lVar149) * lVar37;
              lVar129 = (local_930 - iVar27) * lVar69;
              lVar130 = (lVar2 - lVar149) * lVar37;
              lVar131 = (lVar4 - lVar149) * lVar37;
              lVar132 = (lVar3 - lVar149) * lVar37;
              lVar133 = (local_930 - iVar12) * lVar43;
              lVar134 = (local_930 - iVar176) * lVar34;
              iVar112 = (int)local_930;
              iVar122 = iVar112 - iVar11;
              lVar135 = iVar122 * lVar37;
              lVar136 = (local_930 - lVar159) * lVar47;
              lVar137 = (local_930 - lVar161) * lVar51;
              lVar95 = ((int)lVar3 - iVar11) * lVar37;
              iVar89 = (int)lVar2 - iVar176;
              iVar90 = (int)lVar2 - iVar11;
              lVar96 = iVar90 * lVar37;
              lVar97 = (lVar2 - lVar159) * lVar47;
              lVar98 = (lVar2 - lVar161) * lVar51;
              local_918 = local_928;
              local_820 = local_850;
              local_828 = local_858;
              local_830 = local_860;
              local_920 = lVar148;
              do {
                if (iVar7 <= iVar30) {
                  lVar99 = (local_920 - iVar19) * lVar57;
                  lVar100 = (local_920 - lVar162) * lVar54;
                  lVar101 = (local_920 - lVar145) * lVar36;
                  lVar102 = (local_920 - iVar28) * lVar68;
                  lVar103 = (local_920 - iVar13) * lVar42;
                  lVar104 = (local_920 - iVar182) * lVar33;
                  iVar154 = (int)local_920;
                  iVar91 = iVar154 - iVar10;
                  lVar105 = iVar91 * lVar36;
                  lVar118 = ((local_920 + -1) - lVar162) * lVar54;
                  lVar138 = ((local_920 + 1) - lVar162) * lVar54;
                  lVar106 = ((local_920 + -1) - lVar145) * lVar36;
                  lVar119 = ((local_920 + 1) - lVar145) * lVar36;
                  lVar139 = ((iVar154 + 1) - iVar14) * lVar46;
                  lVar150 = (local_920 - iVar14) * lVar46;
                  lVar163 = (local_920 - iVar141) * lVar50;
                  lVar140 = (int)(~uVar16 + iVar154) * lVar54;
                  lVar168 = (int)((iVar154 + 1) - uVar16) * lVar54;
                  local_7a8 = local_918;
                  local_798 = local_828;
                  local_7a0 = local_830;
                  pdVar151 = local_820;
                  lVar157 = lVar181;
                  local_aa0 = (ulong)uVar153 << 0x20;
                  local_778 = (lVar181 << 0x20) - (lVar175 << 0x20);
                  uVar5 = uVar153;
                  iVar83 = (iVar7 + -1) - iVar8;
                  iVar143 = iVar7 - iVar9;
                  do {
                    lVar107 = lVar157 - iVar20;
                    uVar32 = pEVar56[lVar99 + lVar107 + (local_930 - lVar167) * lVar58].flag;
                    local_9e8 = 0.0;
                    dVar190 = 0.0;
                    if ((uVar32 >> 9 & 1) != 0) {
                      lVar120 = lVar157 - lVar172;
                      dVar206 = pdVar53[lVar100 + lVar120 + lVar124];
                      iVar113 = (int)lVar157;
                      if ((((dVar206 != 1.0) || (NAN(dVar206))) ||
                          (pdVar53[lVar100 + lVar120 + lVar125] != 1.0)) ||
                         (NAN(pdVar53[lVar100 + lVar120 + lVar125]))) {
LAB_00359a8b:
                        lVar108 = lVar157 - lVar158;
                        dVar190 = pdVar41[lVar103 + lVar108 + lVar133];
                        dVar189 = (pdVar41 + lVar103 + lVar108 + lVar133)[lVar44];
                        lVar109 = lVar157 - lVar94;
                        dVar196 = pdVar40[lVar134 + lVar104 + lVar109 + lVar35 * 2];
                        dVar191 = pdVar40[lVar134 + lVar104 + lVar109];
                        dVar195 = pdVar40[lVar134 + lVar104 + lVar109 + lVar35];
                        lVar156 = lVar157 - lVar175;
                        dVar199 = pdVar38[lVar105 + lVar156 + lVar135 + lVar117];
                        dVar210 = pdVar38[lVar105 + lVar156 + lVar130 + lVar117];
                        lVar121 = -1;
                        cVar85 = '\x05';
                        lVar142 = 0;
                        pdVar110 = pdVar151;
                        pdVar170 = local_7a0;
                        pdVar178 = local_798;
                        do {
                          lVar164 = -1;
                          pdVar146 = pdVar110;
                          pdVar169 = pdVar170;
                          pdVar179 = pdVar178;
                          cVar152 = cVar85;
                          do {
                            iVar123 = (int)lVar142;
                            ppdVar165 = &local_3b8.q.p + (long)iVar123 * 3;
                            lVar142 = 0;
                            do {
                              if (((int)lVar142 == 1 && ((int)lVar164 == 0 && (int)lVar121 == 0)) ||
                                 ((1 << (cVar152 + (char)lVar142 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar165 = (double *)0x0;
                                ppdVar165[1] = (double *)0x0;
                                ppdVar165[2] = (double *)0x0;
                              }
                              else {
                                dVar186 = pdVar179[lVar142];
                                *ppdVar165 = (double *)
                                             ((pdVar146[lVar142] + (double)((int)lVar142 + -1)) -
                                             dVar191);
                                ppdVar165[1] = (double *)
                                               ((dVar186 + (double)(int)lVar164) - dVar195);
                                ppdVar165[2] = (double *)
                                               ((pdVar169[lVar142] + (double)(int)lVar121) -
                                               pdVar40[lVar134 + lVar104 + lVar109 + lVar35 * 2]);
                              }
                              lVar142 = lVar142 + 1;
                              ppdVar165 = ppdVar165 + 3;
                            } while (lVar142 != 3);
                            lVar164 = lVar164 + 1;
                            pdVar169 = pdVar169 + lVar33;
                            pdVar179 = pdVar179 + lVar33;
                            pdVar146 = pdVar146 + lVar33;
                            cVar152 = cVar152 + '\x03';
                            lVar142 = (long)iVar123 + 3;
                          } while (lVar164 != 2);
                          lVar121 = lVar121 + 1;
                          pdVar170 = pdVar170 + lVar34;
                          pdVar178 = pdVar178 + lVar34;
                          pdVar110 = pdVar110 + lVar34;
                          cVar85 = cVar85 + '\t';
                          lVar142 = (long)iVar123 + 3;
                        } while (lVar121 != 2);
                        lVar109 = -1;
                        cVar85 = '\x05';
                        lVar121 = 0;
                        do {
                          lVar142 = -1;
                          cVar152 = cVar85;
                          do {
                            iVar123 = (int)lVar121;
                            lVar164 = 0;
                            lVar121 = local_aa0;
                            do {
                              dVar186 = 0.0;
                              if (((int)lVar164 != 1 || ((int)lVar142 != 0 || (int)lVar109 != 0)) &&
                                 ((1 << (cVar152 + (char)lVar164 & 0x1fU) & uVar32) != 0)) {
                                dVar186 = *(double *)
                                           ((long)pdVar38 +
                                           (lVar121 >> 0x1d) +
                                           (iVar91 + (int)lVar142) * lVar36 * 8 +
                                           (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8) -
                                          dVar199;
                              }
                              adStack_108[iVar123 + lVar164] = dVar186;
                              lVar164 = lVar164 + 1;
                              lVar121 = lVar121 + 0x100000000;
                            } while (lVar164 != 3);
                            lVar142 = lVar142 + 1;
                            cVar152 = cVar152 + '\x03';
                            lVar121 = (long)iVar123 + 3;
                          } while (lVar142 != 2);
                          lVar109 = lVar109 + 1;
                          cVar85 = cVar85 + '\t';
                          lVar121 = (long)iVar123 + 3;
                        } while (lVar109 != 2);
                        pdVar110 = &local_408;
                        lVar109 = 0;
                        do {
                          lVar121 = 0;
                          auVar193 = auVar214;
                          do {
                            auVar197 = auVar193 ^ auVar84;
                            if (auVar197._4_4_ == -0x80000000 && auVar197._0_4_ < -0x7ffffffd) {
                              *(undefined8 *)((long)pdVar110 + lVar121) = 0;
                              *(undefined8 *)((long)pdVar110 + lVar121 + 0x18) = 0;
                            }
                            lVar142 = auVar193._8_8_;
                            auVar193._0_8_ = auVar193._0_8_ + 2;
                            auVar193._8_8_ = lVar142 + 2;
                            lVar121 = lVar121 + 0x30;
                          } while (lVar121 != 0x60);
                          lVar109 = lVar109 + 1;
                          pdVar110 = pdVar110 + 1;
                        } while (lVar109 != 3);
                        dVar203 = 0.0;
                        dVar201 = 0.0;
                        dVar213 = 0.0;
                        pLVar111 = &local_3b8.q.kstride;
                        lVar109 = 0;
                        dVar186 = local_3f8;
                        dVar204 = local_3c8;
                        dVar202 = local_408;
                        dVar200 = local_400;
                        dVar209 = local_3e8;
                        dVar211 = dStack_3e0;
                        do {
                          dVar187 = (double)*pLVar111;
                          pdVar110 = ((Array4<const_double> *)(pLVar111 + -2))->p;
                          dVar207 = (double)pLVar111[-1];
                          dVar209 = dVar209 + dVar207 * (double)pLVar111[-1];
                          dVar211 = dVar211 + dVar207 * (double)*pLVar111;
                          dVar204 = dVar204 + dVar187 * dVar187;
                          dVar205 = adStack_108[lVar109];
                          dVar202 = dVar202 + (double)pdVar110 * (double)pdVar110;
                          dVar203 = dVar203 + dVar205 * (double)pdVar110;
                          dVar200 = dVar200 + dVar207 * (double)pdVar110;
                          dVar201 = dVar201 + dVar205 * dVar207;
                          dVar186 = dVar186 + dVar187 * (double)pdVar110;
                          dVar213 = dVar213 + dVar205 * dVar187;
                          lVar109 = lVar109 + 1;
                          pLVar111 = pLVar111 + 3;
                        } while (lVar109 != 0x1b);
                        dVar187 = dVar209 * dVar204 - dVar211 * dVar211;
                        dVar205 = dVar204 * dVar200 - dVar186 * dVar211;
                        dVar204 = dVar204 * dVar201 - dVar213 * dVar211;
                        dVar207 = dVar200 * dVar211 - dVar209 * dVar186;
                        local_ae8 = dVar186 * dVar207 + (dVar187 * dVar202 - dVar200 * dVar205);
                        local_ab8 = (dVar186 * (dVar201 * dVar211 - dVar209 * dVar213) +
                                    (dVar187 * dVar203 - dVar200 * dVar204)) / local_ae8;
                        if ((dVar206 == 1.0) && (!NAN(dVar206))) {
                          if ((pdVar53[lVar100 + lVar124 + ((lVar157 + -1) - lVar172)] == 1.0) &&
                             (!NAN(pdVar53[lVar100 + lVar124 + ((lVar157 + -1) - lVar172)]))) {
                            if ((pdVar53[lVar100 + lVar124 + ((lVar157 + 1) - lVar172)] == 1.0) &&
                               (!NAN(pdVar53[lVar100 + lVar124 + ((lVar157 + 1) - lVar172)]))) {
                              dVar188 = dVar199 - pdVar38[lVar105 + lVar135 + lVar117 + ((lVar157 +
                                                                                         -1) - 
                                                  lVar175)];
                              dVar192 = pdVar38[lVar105 + lVar135 + lVar117 + ((lVar157 + 1) -
                                                                              lVar175)] - dVar199;
                              dVar188 = dVar188 + dVar188;
                              dVar192 = dVar192 + dVar192;
                              dVar187 = (pdVar38[lVar105 + lVar135 + lVar117 + ((lVar157 + 1) -
                                                                               lVar175)] -
                                        pdVar38[lVar105 + lVar135 + lVar117 + ((lVar157 + -1) -
                                                                              lVar175)]) * 0.5;
                              dVar208 = ABS(dVar188);
                              uVar184 = -(ulong)(0.0 < dVar187);
                              dVar187 = ABS(dVar187);
                              dVar198 = ABS(dVar192);
                              if (dVar208 <= dVar187) {
                                dVar187 = dVar208;
                              }
                              if (dVar187 <= dVar198) {
                                dVar198 = dVar187;
                              }
                              uVar194 = -(ulong)(0.0 < dVar188 * dVar192) & (ulong)dVar198;
                              local_ab8 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                                  uVar184 & uVar194);
                            }
                          }
                        }
                        dVar187 = dVar200 * dVar213 - dVar186 * dVar201;
                        dVar186 = (dVar186 * dVar187 + (dVar204 * dVar202 - dVar205 * dVar203)) /
                                  local_ae8;
                        if ((((dVar206 == 1.0) && (!NAN(dVar206))) &&
                            (pdVar53[lVar118 + lVar124 + lVar120] == 1.0)) &&
                           (((!NAN(pdVar53[lVar118 + lVar124 + lVar120]) &&
                             (pdVar53[lVar138 + lVar124 + lVar120] == 1.0)) &&
                            (!NAN(pdVar53[lVar138 + lVar124 + lVar120]))))) {
                          dVar205 = dVar199 - pdVar38[lVar106 + lVar135 + lVar117 + lVar156];
                          dVar198 = pdVar38[lVar119 + lVar135 + lVar117 + lVar156] - dVar199;
                          dVar205 = dVar205 + dVar205;
                          dVar198 = dVar198 + dVar198;
                          dVar186 = (pdVar38[lVar119 + lVar135 + lVar117 + lVar156] -
                                    pdVar38[lVar106 + lVar135 + lVar117 + lVar156]) * 0.5;
                          dVar188 = ABS(dVar205);
                          uVar184 = -(ulong)(0.0 < dVar186);
                          dVar186 = ABS(dVar186);
                          dVar204 = ABS(dVar198);
                          if (dVar188 <= dVar186) {
                            dVar186 = dVar188;
                          }
                          if (dVar186 <= dVar204) {
                            dVar204 = dVar186;
                          }
                          uVar194 = -(ulong)(0.0 < dVar205 * dVar198) & (ulong)dVar204;
                          dVar186 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                            uVar184 & uVar194);
                        }
                        dVar204 = 1.0;
                        local_ae8 = (dVar203 * dVar207 +
                                    (dVar202 * (dVar209 * dVar213 - dVar211 * dVar201) -
                                    dVar187 * dVar200)) / local_ae8;
                        if (((dVar206 == 1.0) && (!NAN(dVar206))) &&
                           ((pdVar53[lVar100 + lVar120 + lVar125] == 1.0 &&
                            (((!NAN(pdVar53[lVar100 + lVar120 + lVar125]) &&
                              (pdVar53[lVar100 + lVar120 + lVar127] == 1.0)) &&
                             (!NAN(pdVar53[lVar100 + lVar120 + lVar127]))))))) {
                          dVar211 = pdVar38[lVar105 + lVar156 + lVar131 + lVar117] - dVar199;
                          dVar209 = (dVar199 - dVar210) + (dVar199 - dVar210);
                          dVar211 = dVar211 + dVar211;
                          dVar200 = (pdVar38[lVar105 + lVar156 + lVar131 + lVar117] - dVar210) * 0.5
                          ;
                          dVar201 = ABS(dVar209);
                          uVar184 = -(ulong)(0.0 < dVar200);
                          dVar200 = ABS(dVar200);
                          dVar202 = ABS(dVar211);
                          if (dVar201 <= dVar200) {
                            dVar200 = dVar201;
                          }
                          if (dVar200 <= dVar202) {
                            dVar202 = dVar200;
                          }
                          uVar194 = -(ulong)(0.0 < dVar209 * dVar211) & (ulong)dVar202;
                          local_ae8 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                              uVar184 & uVar194);
                        }
                        local_9e8 = dVar210;
                        if (dVar199 <= dVar210) {
                          local_9e8 = dVar199;
                        }
                        dVar189 = dVar189 - dVar195;
                        if (dVar210 <= dVar199) {
                          dVar210 = dVar199;
                        }
                        dVar190 = dVar190 - dVar191;
                        iVar92 = 0;
                        iVar123 = 0;
                        iVar144 = 0;
                        iVar180 = 0;
                        uVar147 = 0xffffffff;
                        do {
                          uVar114 = uVar147 + 1;
                          uVar155 = 0xffffffff;
                          iVar174 = iVar92;
                          do {
                            uVar1 = uVar155 + 1;
                            iVar115 = 5;
                            do {
                              if (((uVar32 >> (iVar174 + iVar115 & 0x1fU) & 1) != 0) &&
                                 ((iVar115 != 6 || uVar155 != 0) || uVar147 != 0)) {
                                iVar123 = iVar123 + (uint)((iVar115 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar155 == 0 && uVar147 == 0));
                                iVar144 = iVar144 + (uint)((iVar115 == 6 && uVar147 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar180 = iVar180 + (uint)((iVar115 == 6 && uVar155 == 0) &&
                                                          (uVar114 & 0xfffffffd) == 0);
                              }
                              iVar115 = iVar115 + 1;
                            } while (iVar115 != 8);
                            iVar174 = iVar174 + 3;
                            uVar155 = uVar1;
                          } while (uVar1 != 2);
                          iVar92 = iVar92 + 9;
                          uVar147 = uVar114;
                        } while (uVar114 != 2);
                        dVar202 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar109 = -1;
                          cVar85 = '\b';
                          dVar200 = dVar199;
                          dVar202 = dVar199;
                          do {
                            lVar121 = 0;
                            cVar152 = cVar85;
                            do {
                              lVar156 = -1;
                              lVar142 = local_aa0;
                              do {
                                if ((((int)lVar121 != 0 || (int)lVar109 != 0) || (int)lVar156 != 0)
                                   && ((1 << (cVar152 + (char)lVar156 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar209 = *(double *)
                                             ((long)pdVar38 +
                                             (lVar142 >> 0x1d) +
                                             (iVar91 + (int)lVar121) * lVar36 * 8 +
                                             (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8);
                                  dVar211 = dVar209;
                                  if (dVar209 <= dVar202) {
                                    dVar211 = dVar202;
                                  }
                                  dVar202 = dVar211;
                                  if (dVar209 < dVar200) {
                                    dVar200 = dVar209;
                                  }
                                }
                                lVar156 = lVar156 + 1;
                                lVar142 = lVar142 + 0x100000000;
                              } while (lVar156 != 2);
                              cVar152 = cVar152 + '\x03';
                              bVar183 = lVar121 == 0;
                              lVar121 = lVar121 + 1;
                            } while (bVar183);
                            lVar109 = lVar109 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar109 != 2);
                          dVar209 = (((pdVar45 + lVar139 + lVar136 + (lVar157 - lVar160))[lVar48] -
                                     dVar196) * local_ae8 +
                                    (0.5 - dVar195) * dVar186 +
                                    (pdVar45[lVar139 + lVar136 + (lVar157 - lVar160)] - dVar191) *
                                    local_ab8 + dVar199) - dVar199;
                          if (dVar209 <= 1e-13) {
                            dVar202 = 1.0;
                            if ((dVar209 < -1e-13) &&
                               (dVar202 = (dVar200 - dVar199) / dVar209, 1.0 <= dVar202)) {
                              dVar202 = 1.0;
                            }
                          }
                          else {
                            dVar202 = (dVar202 - dVar199) / dVar209;
                            if (1.0 <= dVar202) {
                              dVar202 = dVar204;
                            }
                          }
                          if (2.0 <= dVar202) {
                            dVar202 = 2.0;
                          }
                        }
                        dVar200 = dVar202;
                        if ((short)uVar32 < 0) {
                          lVar109 = -1;
                          cVar85 = '\x05';
                          dVar200 = dVar199;
                          dVar209 = dVar199;
                          do {
                            lVar121 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar156 = -1;
                              lVar142 = local_aa0;
                              do {
                                if ((((int)lVar121 != 0 || (int)lVar109 != 0) || (int)lVar156 != 0)
                                   && ((1 << (cVar152 + (char)lVar156 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = *(double *)
                                             ((long)pdVar38 +
                                             (lVar142 >> 0x1d) +
                                             (iVar91 + (int)lVar121) * lVar36 * 8 +
                                             (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8);
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar200) {
                                    dVar201 = dVar200;
                                  }
                                  dVar200 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar156 = lVar156 + 1;
                                lVar142 = lVar142 + 0x100000000;
                              } while (lVar156 != 2);
                              cVar152 = cVar152 + '\x03';
                              bVar183 = lVar121 != 0;
                              lVar121 = lVar121 + 1;
                            } while (bVar183);
                            lVar109 = lVar109 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar109 != 2);
                          dVar211 = (((pdVar45 + lVar150 + lVar136 + (lVar157 - lVar160))[lVar48] -
                                     dVar196) * local_ae8 +
                                    (((pdVar45[lVar150 + lVar136 + (lVar157 - lVar160)] - dVar191) *
                                      local_ab8 + dVar199) - (dVar195 + 0.5) * dVar186)) - dVar199;
                          if (dVar211 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar200 = (dVar209 - dVar199) / dVar211, 1.0 <= dVar200)) {
                              dVar200 = dVar204;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar199) / dVar211;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar202 <= dVar200) {
                            dVar200 = dVar202;
                          }
                        }
                        dVar202 = dVar200;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar109 = -1;
                          cVar85 = '\x06';
                          dVar209 = dVar199;
                          dVar202 = dVar199;
                          do {
                            lVar121 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar156 = 0;
                              lVar142 = local_778;
                              do {
                                if ((((int)lVar121 != 0 || (int)lVar109 != 0) || (int)lVar156 != 0)
                                   && ((1 << (cVar152 + (char)lVar156 & 0x1fU) & uVar32) != 0)) {
                                  dVar211 = *(double *)
                                             ((long)pdVar38 +
                                             (lVar142 >> 0x1d) +
                                             (iVar91 + (int)lVar121) * lVar36 * 8 +
                                             (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8);
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar202) {
                                    dVar201 = dVar202;
                                  }
                                  dVar202 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar156 = lVar156 + 1;
                                lVar142 = lVar142 + 0x100000000;
                              } while (lVar156 == 1);
                              lVar121 = lVar121 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar121 != 2);
                            lVar109 = lVar109 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar109 != 2);
                          dVar211 = (((pdVar49 + lVar163 + lVar137 + ((iVar113 - iVar15) + 1))
                                      [lVar52] - dVar196) * local_ae8 +
                                    (pdVar49[lVar163 + lVar137 + ((iVar113 - iVar15) + 1)] - dVar195
                                    ) * dVar186 + (0.5 - dVar191) * local_ab8 + dVar199) - dVar199;
                          if (dVar211 <= 1e-13) {
                            dVar202 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar202 = (dVar209 - dVar199) / dVar211, 1.0 <= dVar202)) {
                              dVar202 = 1.0;
                            }
                          }
                          else {
                            dVar202 = (dVar202 - dVar199) / dVar211;
                            if (1.0 <= dVar202) {
                              dVar202 = dVar204;
                            }
                          }
                          if (dVar200 <= dVar202) {
                            dVar202 = dVar200;
                          }
                        }
                        dVar200 = dVar202;
                        if ((uVar32 >> 0x11 & 1) != 0) {
                          lVar109 = -1;
                          cVar85 = '\x05';
                          dVar209 = dVar199;
                          dVar200 = dVar199;
                          do {
                            lVar121 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar156 = -1;
                              lVar142 = local_aa0;
                              do {
                                if ((((int)lVar121 != 0 || (int)lVar109 != 0) || (int)lVar156 != 0)
                                   && ((1 << (cVar152 + (char)lVar156 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = *(double *)
                                             ((long)pdVar38 +
                                             (lVar142 >> 0x1d) +
                                             (iVar91 + (int)lVar121) * lVar36 * 8 +
                                             (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8);
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar200) {
                                    dVar201 = dVar200;
                                  }
                                  dVar200 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar156 = lVar156 + 1;
                                lVar142 = lVar142 + 0x100000000;
                              } while (lVar156 != 1);
                              lVar121 = lVar121 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar121 != 2);
                            lVar109 = lVar109 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar109 != 2);
                          dVar211 = (((pdVar49 + lVar163 + lVar137 + (lVar157 - iVar15))[lVar52] -
                                     dVar196) * local_ae8 +
                                    (pdVar49[lVar163 + lVar137 + (lVar157 - iVar15)] - dVar195) *
                                    dVar186 + (dVar199 - (dVar191 + 0.5) * local_ab8)) - dVar199;
                          if (dVar211 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar200 = (dVar209 - dVar199) / dVar211, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar199) / dVar211;
                            if (1.0 <= dVar200) {
                              dVar200 = dVar204;
                            }
                          }
                          if (dVar202 <= dVar200) {
                            dVar200 = dVar202;
                          }
                        }
                        dVar202 = dVar200;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          cVar85 = '\x0e';
                          lVar109 = 0;
                          dVar209 = dVar199;
                          dVar202 = dVar199;
                          do {
                            lVar121 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar156 = -1;
                              lVar142 = local_aa0;
                              do {
                                if ((((int)lVar121 != 0 || (int)lVar109 != 0) || (int)lVar156 != 0)
                                   && ((1 << (cVar152 + (char)lVar156 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = *(double *)
                                             ((long)pdVar38 +
                                             (lVar142 >> 0x1d) +
                                             (iVar91 + (int)lVar121) * lVar36 * 8 +
                                             (iVar122 + (int)lVar109) * lVar37 * 8 + lVar117 * 8);
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar202) {
                                    dVar201 = dVar202;
                                  }
                                  dVar202 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar156 = lVar156 + 1;
                                lVar142 = lVar142 + 0x100000000;
                              } while (lVar156 != 2);
                              lVar121 = lVar121 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar121 != 2);
                            cVar85 = cVar85 + '\t';
                            bVar183 = lVar109 == 0;
                            lVar109 = lVar109 + 1;
                          } while (bVar183);
                          dVar191 = ((0.5 - dVar196) * local_ae8 +
                                    ((pdVar41 +
                                     lVar103 + lVar108 + ((iVar112 + 1) - iVar12) * lVar43)[lVar44]
                                    - dVar195) * dVar186 +
                                    (pdVar41[lVar103 + lVar108 + ((iVar112 + 1) - iVar12) * lVar43]
                                    - dVar191) * local_ab8 + dVar199) - dVar199;
                          if (dVar191 <= 1e-13) {
                            dVar202 = 1.0;
                            if ((dVar191 < -1e-13) &&
                               (dVar202 = (dVar209 - dVar199) / dVar191, 1.0 <= dVar202)) {
                              dVar202 = dVar204;
                            }
                          }
                          else {
                            dVar202 = (dVar202 - dVar199) / dVar191;
                            if (1.0 <= dVar202) {
                              dVar202 = 1.0;
                            }
                          }
                          if (dVar200 <= dVar202) {
                            dVar202 = dVar200;
                          }
                        }
                        cVar85 = '\x05';
                        lVar108 = -1;
                        dVar191 = dVar199;
                        dVar195 = dVar199;
                        do {
                          lVar109 = -1;
                          cVar152 = cVar85;
                          do {
                            lVar142 = -1;
                            lVar121 = local_aa0;
                            do {
                              if ((((int)lVar109 != 0 || (int)lVar108 != 0) || (int)lVar142 != 0) &&
                                 ((1 << (cVar152 + (char)lVar142 + 1U & 0x1f) & uVar32) != 0)) {
                                dVar200 = *(double *)
                                           ((long)pdVar38 +
                                           (lVar121 >> 0x1d) +
                                           (iVar91 + (int)lVar109) * lVar36 * 8 +
                                           (iVar122 + (int)lVar108) * lVar37 * 8 + lVar117 * 8);
                                dVar209 = dVar200;
                                if (dVar200 <= dVar195) {
                                  dVar209 = dVar195;
                                }
                                dVar195 = dVar209;
                                if (dVar200 < dVar191) {
                                  dVar191 = dVar200;
                                }
                              }
                              lVar142 = lVar142 + 1;
                              lVar121 = lVar121 + 0x100000000;
                            } while (lVar142 != 2);
                            lVar109 = lVar109 + 1;
                            cVar152 = cVar152 + '\x03';
                          } while (lVar109 != 2);
                          cVar85 = cVar85 + '\t';
                          bVar183 = lVar108 != 0;
                          lVar108 = lVar108 + 1;
                        } while (bVar183);
                        dVar200 = ((dVar189 * dVar186 + dVar190 * local_ab8 + dVar199) -
                                  (dVar196 + 0.5) * local_ae8) - dVar199;
                        if (dVar200 <= 1e-13) {
                          dVar195 = 1.0;
                          if ((dVar200 < -1e-13) &&
                             (dVar195 = (dVar191 - dVar199) / dVar200, 1.0 <= dVar195)) {
                            dVar195 = 1.0;
                          }
                        }
                        else {
                          dVar195 = (dVar195 - dVar199) / dVar200;
                          if (1.0 <= dVar195) {
                            dVar195 = dVar204;
                          }
                        }
                        if (dVar202 <= dVar195) {
                          dVar195 = dVar202;
                        }
                        dVar191 = 0.0;
                        if (1 < iVar123) {
                          dVar191 = dVar195;
                        }
                        dVar202 = 0.0;
                        if (1 < iVar144) {
                          dVar202 = dVar195;
                        }
                        dVar200 = 0.0;
                        if (1 < iVar180) {
                          dVar200 = dVar195;
                        }
                        if (((((dVar206 == 1.0) && (!NAN(dVar206))) &&
                             (pdVar53[lVar100 + lVar124 + (int)(~uVar18 + iVar113)] == 1.0)) &&
                            ((!NAN(pdVar53[lVar100 + lVar124 + (int)(~uVar18 + iVar113)]) &&
                             (pdVar53[lVar100 + lVar124 + (int)((iVar113 - uVar18) + 1)] == 1.0))))
                           && (!NAN(pdVar53[lVar100 + lVar124 + (int)((iVar113 - uVar18) + 1)]))) {
                          dVar191 = 1.0;
                        }
                        if (((dVar206 == 1.0) && (!NAN(dVar206))) &&
                           ((pdVar53[lVar140 + lVar124 + lVar120] == 1.0 &&
                            (((!NAN(pdVar53[lVar140 + lVar124 + lVar120]) &&
                              (pdVar53[lVar168 + lVar124 + lVar120] == 1.0)) &&
                             (!NAN(pdVar53[lVar168 + lVar124 + lVar120]))))))) {
                          dVar202 = dVar204;
                        }
                        if (((dVar206 == 1.0) && (!NAN(dVar206))) &&
                           (((pdVar53[lVar100 + lVar120 + lVar125] == 1.0 &&
                             ((!NAN(pdVar53[lVar100 + lVar120 + lVar125]) &&
                              (pdVar53[lVar100 + lVar120 + ((iVar112 + 1) - iVar17) * lVar55] == 1.0
                              )))) && (!NAN(pdVar53[lVar100 + lVar120 + ((iVar112 + 1) - iVar17) *
                                                                        lVar55]))))) {
                          dVar200 = 1.0;
                        }
                        dVar190 = dVar189 * dVar186 * dVar202 +
                                  dVar190 * local_ab8 * dVar191 +
                                  -(dVar196 + 0.5) * local_ae8 * dVar200 + dVar199;
                        if (dVar190 <= dVar210) {
                          dVar210 = dVar190;
                        }
                        if (local_9e8 <= dVar210) {
                          local_9e8 = dVar210;
                        }
                        local_9e8 = pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] *
                                    dVar185 * -0.5 * local_ae8 * dVar200 + local_9e8;
                        auVar214 = _DAT_006979b0;
                      }
                      else if (((pdVar53[lVar100 + lVar120 + lVar126] != 1.0) ||
                               (NAN(pdVar53[lVar100 + lVar120 + lVar126]))) ||
                              (((pdVar53[lVar100 + lVar120 + lVar127] != 1.0 ||
                                ((NAN(pdVar53[lVar100 + lVar120 + lVar127]) ||
                                 (pdVar53[lVar100 + lVar120 + ((local_930 + 2) - lVar171) * lVar55]
                                  != 1.0)))) ||
                               (NAN(pdVar53[lVar100 + lVar120 + ((local_930 + 2) - lVar171) * lVar55
                                           ]))))) {
                        if ((pdVar53[lVar100 + lVar120 + lVar127] != 1.0) ||
                           (NAN(pdVar53[lVar100 + lVar120 + lVar127]))) goto LAB_00359a8b;
                        lVar108 = lVar157 - lVar175;
                        local_9e8 = pdVar38[lVar101 + lVar108 + lVar128 + lVar117];
                        dVar191 = local_9e8 - pdVar38[lVar101 + lVar108 + lVar130 + lVar117];
                        dVar195 = pdVar38[lVar101 + lVar108 + lVar131 + lVar117] - local_9e8;
                        dVar191 = dVar191 + dVar191;
                        dVar195 = dVar195 + dVar195;
                        dVar190 = (pdVar38[lVar101 + lVar108 + lVar131 + lVar117] -
                                  pdVar38[lVar101 + lVar108 + lVar130 + lVar117]) * 0.5;
                        dVar196 = ABS(dVar191);
                        uVar184 = -(ulong)(0.0 < dVar190);
                        dVar190 = ABS(dVar190);
                        dVar189 = ABS(dVar195);
                        if (dVar196 <= dVar190) {
                          dVar190 = dVar196;
                        }
                        if (dVar190 <= dVar189) {
                          dVar189 = dVar190;
                        }
                        uVar194 = -(ulong)(0.0 < dVar191 * dVar195) & (ulong)dVar189;
                        local_9e8 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                            uVar184 & uVar194) *
                                    (-1.0 - pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] *
                                            dVar185) * 0.5 + local_9e8;
                      }
                      else {
                        lVar108 = lVar157 - lVar175;
                        local_9e8 = pdVar38[lVar101 + lVar108 + lVar128 + lVar117];
                        dVar196 = local_9e8 - pdVar38[lVar101 + lVar108 + lVar130 + lVar117];
                        dVar191 = pdVar38[lVar101 + lVar108 + lVar130 + lVar117] -
                                  pdVar38[lVar101 + lVar108 + lVar132 + lVar117];
                        dVar189 = 0.0;
                        dVar190 = 0.0;
                        if (0.0 <= dVar196 * dVar191) {
                          dVar190 = ABS(dVar196);
                          if (ABS(dVar191) <= ABS(dVar196)) {
                            dVar190 = ABS(dVar191);
                          }
                          dVar190 = dVar190 + dVar190;
                        }
                        dVar199 = pdVar38[lVar101 + lVar108 + ((local_930 + 2) - lVar149) * lVar37 +
                                                              lVar117] -
                                  pdVar38[lVar101 + lVar108 + lVar131 + lVar117];
                        dVar210 = pdVar38[lVar101 + lVar108 + lVar131 + lVar117] - local_9e8;
                        dVar195 = (dVar210 + dVar199) * 0.5;
                        if (0.0 <= dVar210 * dVar199) {
                          dVar189 = ABS(dVar199);
                          if (ABS(dVar210) <= ABS(dVar199)) {
                            dVar189 = ABS(dVar210);
                          }
                          dVar189 = dVar189 + dVar189;
                        }
                        dVar186 = (dVar196 + dVar210) * 0.5;
                        dVar199 = 0.0;
                        if (0.0 <= dVar196 * dVar210) {
                          dVar199 = ABS(dVar210);
                          if (ABS(dVar196) <= ABS(dVar210)) {
                            dVar199 = ABS(dVar196);
                          }
                          dVar199 = dVar199 + dVar199;
                        }
                        dVar191 = (dVar196 + dVar191) * 0.5;
                        dVar196 = ABS(dVar191);
                        if (dVar190 <= dVar196) {
                          dVar196 = dVar190;
                        }
                        dVar190 = ABS(dVar195);
                        if (dVar189 <= dVar190) {
                          dVar190 = dVar189;
                        }
                        dVar190 = ABS(dVar186 * 1.3333333333333333 +
                                      (dVar190 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                         0x3ff0000000000000) +
                                      dVar196 * (double)((ulong)dVar191 & 0x8000000000000000 |
                                                        0x3ff0000000000000)) * -0.16666666666666666)
                        ;
                        if (dVar199 <= dVar190) {
                          dVar190 = dVar199;
                        }
                        local_9e8 = dVar190 * (double)((ulong)dVar186 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (-1.0 - pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] *
                                            dVar185) * 0.5 + local_9e8;
                      }
                      dVar189 = pdVar53[lVar100 + lVar120 + lVar125];
                      if ((dVar189 != 1.0) || (NAN(dVar189))) {
LAB_0035b806:
                        lVar108 = lVar157 - lVar158;
                        dVar196 = pdVar41[lVar103 + lVar108 + lVar133];
                        dVar191 = (pdVar41 + lVar103 + lVar108 + lVar133)[lVar44];
                        pdVar110 = pdVar40 + iVar89 * lVar34 +
                                             (iVar154 - iVar182) * lVar33 + (iVar113 - lVar94);
                        dVar195 = pdVar110[lVar35 * 2];
                        dVar199 = *pdVar110;
                        dVar210 = pdVar110[lVar35];
                        lVar109 = (long)(iVar113 - iVar9);
                        dVar186 = pdVar38[lVar105 + lVar109 + lVar128 + lVar117];
                        dVar204 = pdVar38[lVar105 + lVar109 + lVar96 + lVar117];
                        uVar32 = pEVar56[lVar99 + lVar107 + (lVar2 - lVar167) * lVar58].flag;
                        lVar121 = -1;
                        cVar85 = '\x05';
                        lVar107 = 0;
                        do {
                          iVar123 = (int)lVar121;
                          lVar142 = -1;
                          cVar152 = cVar85;
                          do {
                            iVar92 = (int)lVar142;
                            iVar144 = (int)lVar107;
                            ppdVar165 = &local_3b8.q.p + (long)iVar144 * 3;
                            lVar107 = 0;
                            do {
                              iVar180 = (int)lVar107;
                              if ((iVar180 == 1 && (iVar92 == 0 && iVar123 == 0)) ||
                                 ((1 << (cVar152 + (char)lVar107 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar165 = (double *)0x0;
                                ppdVar165[1] = (double *)0x0;
                                ppdVar165[2] = (double *)0x0;
                              }
                              else {
                                pdVar110 = pdVar40 + (iVar89 + iVar123) * lVar34 +
                                                     ((iVar154 - iVar182) + iVar92) * lVar33 +
                                                     (long)(iVar83 + iVar180);
                                dVar190 = pdVar110[lVar35];
                                *ppdVar165 = (double *)
                                             ((*pdVar110 + (double)(iVar180 + -1)) - dVar199);
                                ppdVar165[1] = (double *)((dVar190 + (double)iVar92) - dVar210);
                                ppdVar165[2] = (double *)
                                               ((pdVar110[lVar35 * 2] + (double)iVar123) - dVar195);
                              }
                              lVar107 = lVar107 + 1;
                              ppdVar165 = ppdVar165 + 3;
                            } while (lVar107 != 3);
                            lVar142 = lVar142 + 1;
                            cVar152 = cVar152 + '\x03';
                            lVar107 = (long)iVar144 + 3;
                          } while (lVar142 != 2);
                          lVar121 = lVar121 + 1;
                          cVar85 = cVar85 + '\t';
                          lVar107 = (long)iVar144 + 3;
                        } while (lVar121 != 2);
                        lVar121 = -1;
                        cVar85 = '\x05';
                        lVar107 = 0;
                        do {
                          lVar142 = -1;
                          cVar152 = cVar85;
                          do {
                            iVar123 = (int)lVar107;
                            lVar107 = 0;
                            do {
                              dVar190 = 0.0;
                              if (((int)lVar107 != 1 || ((int)lVar142 != 0 || (int)lVar121 != 0)) &&
                                 ((1 << (cVar152 + (char)lVar107 & 0x1fU) & uVar32) != 0)) {
                                dVar190 = pdVar38[lVar117 + (iVar90 + (int)lVar121) * lVar37 +
                                                            (iVar91 + (int)lVar142) * lVar36 +
                                                            (long)(int)(uVar5 + (int)lVar107)] -
                                          dVar204;
                              }
                              adStack_108[iVar123 + lVar107] = dVar190;
                              lVar107 = lVar107 + 1;
                            } while (lVar107 != 3);
                            lVar142 = lVar142 + 1;
                            cVar152 = cVar152 + '\x03';
                            lVar107 = (long)iVar123 + 3;
                          } while (lVar142 != 2);
                          lVar121 = lVar121 + 1;
                          cVar85 = cVar85 + '\t';
                          lVar107 = (long)iVar123 + 3;
                        } while (lVar121 != 2);
                        pdVar110 = &local_408;
                        lVar107 = 0;
                        do {
                          lVar121 = 0;
                          auVar197 = auVar214;
                          do {
                            auVar193 = auVar197 ^ auVar84;
                            if (auVar193._4_4_ == -0x80000000 && auVar193._0_4_ < -0x7ffffffd) {
                              *(undefined8 *)((long)pdVar110 + lVar121) = 0;
                              *(undefined8 *)((long)pdVar110 + lVar121 + 0x18) = 0;
                            }
                            lVar142 = auVar197._8_8_;
                            auVar197._0_8_ = auVar197._0_8_ + 2;
                            auVar197._8_8_ = lVar142 + 2;
                            lVar121 = lVar121 + 0x30;
                          } while (lVar121 != 0x60);
                          lVar107 = lVar107 + 1;
                          pdVar110 = pdVar110 + 1;
                        } while (lVar107 != 3);
                        dVar203 = 0.0;
                        dVar213 = 0.0;
                        dVar187 = 0.0;
                        pLVar111 = &local_3b8.q.kstride;
                        lVar107 = 0;
                        dVar190 = local_3f8;
                        dVar202 = local_3c8;
                        dVar200 = local_408;
                        dVar209 = local_400;
                        dVar211 = local_3e8;
                        dVar201 = dStack_3e0;
                        do {
                          dVar205 = (double)*pLVar111;
                          pdVar110 = ((Array4<const_double> *)(pLVar111 + -2))->p;
                          dVar198 = (double)pLVar111[-1];
                          dVar211 = dVar211 + dVar198 * (double)pLVar111[-1];
                          dVar201 = dVar201 + dVar198 * (double)*pLVar111;
                          dVar202 = dVar202 + dVar205 * dVar205;
                          dVar207 = adStack_108[lVar107];
                          dVar200 = dVar200 + (double)pdVar110 * (double)pdVar110;
                          dVar203 = dVar203 + dVar207 * (double)pdVar110;
                          dVar209 = dVar209 + dVar198 * (double)pdVar110;
                          dVar213 = dVar213 + dVar207 * dVar198;
                          dVar190 = dVar190 + dVar205 * (double)pdVar110;
                          dVar187 = dVar187 + dVar207 * dVar205;
                          lVar107 = lVar107 + 1;
                          pLVar111 = pLVar111 + 3;
                        } while (lVar107 != 0x1b);
                        dVar207 = dVar211 * dVar202 - dVar201 * dVar201;
                        dVar205 = dVar202 * dVar209 - dVar190 * dVar201;
                        dVar202 = dVar202 * dVar213 - dVar187 * dVar201;
                        dVar198 = dVar209 * dVar201 - dVar211 * dVar190;
                        local_ae8 = dVar190 * dVar198 + (dVar207 * dVar200 - dVar209 * dVar205);
                        local_a28 = (dVar190 * (dVar213 * dVar201 - dVar211 * dVar187) +
                                    (dVar207 * dVar203 - dVar209 * dVar202)) / local_ae8;
                        if ((dVar189 == 1.0) && (!NAN(dVar189))) {
                          if ((pdVar53[lVar100 + lVar125 + ((lVar157 + -1) - lVar172)] == 1.0) &&
                             (!NAN(pdVar53[lVar100 + lVar125 + ((lVar157 + -1) - lVar172)]))) {
                            if ((pdVar53[lVar100 + lVar125 + ((lVar157 + 1) - lVar172)] == 1.0) &&
                               (!NAN(pdVar53[lVar100 + lVar125 + ((lVar157 + 1) - lVar172)]))) {
                              dVar192 = dVar204 - pdVar38[lVar105 + lVar96 + lVar117 + ((lVar157 +
                                                                                        -1) - 
                                                  lVar175)];
                              dVar208 = pdVar38[lVar105 + lVar96 + lVar117 + ((lVar157 + 1) -
                                                                             lVar175)] - dVar204;
                              dVar192 = dVar192 + dVar192;
                              dVar208 = dVar208 + dVar208;
                              dVar207 = (pdVar38[lVar105 + lVar96 + lVar117 + ((lVar157 + 1) -
                                                                              lVar175)] -
                                        pdVar38[lVar105 + lVar96 + lVar117 + ((lVar157 + -1) -
                                                                             lVar175)]) * 0.5;
                              dVar212 = ABS(dVar192);
                              uVar184 = -(ulong)(0.0 < dVar207);
                              dVar207 = ABS(dVar207);
                              dVar188 = ABS(dVar208);
                              if (dVar212 <= dVar207) {
                                dVar207 = dVar212;
                              }
                              if (dVar207 <= dVar188) {
                                dVar188 = dVar207;
                              }
                              uVar194 = -(ulong)(0.0 < dVar192 * dVar208) & (ulong)dVar188;
                              local_a28 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                                  uVar184 & uVar194);
                            }
                          }
                        }
                        dVar207 = dVar209 * dVar187 - dVar190 * dVar213;
                        local_ab8 = (dVar190 * dVar207 + (dVar202 * dVar200 - dVar205 * dVar203)) /
                                    local_ae8;
                        if (((((dVar189 == 1.0) && (!NAN(dVar189))) &&
                             (pdVar53[lVar118 + lVar125 + lVar120] == 1.0)) &&
                            ((!NAN(pdVar53[lVar118 + lVar125 + lVar120]) &&
                             (pdVar53[lVar138 + lVar125 + lVar120] == 1.0)))) &&
                           (!NAN(pdVar53[lVar138 + lVar125 + lVar120]))) {
                          dVar188 = dVar204 - pdVar38[lVar106 + lVar96 + lVar117 + lVar109];
                          dVar192 = pdVar38[lVar119 + lVar96 + lVar117 + lVar109] - dVar204;
                          dVar188 = dVar188 + dVar188;
                          dVar192 = dVar192 + dVar192;
                          dVar190 = (pdVar38[lVar119 + lVar96 + lVar117 + lVar109] -
                                    pdVar38[lVar106 + lVar96 + lVar117 + lVar109]) * 0.5;
                          dVar205 = ABS(dVar188);
                          uVar184 = -(ulong)(0.0 < dVar190);
                          dVar190 = ABS(dVar190);
                          dVar202 = ABS(dVar192);
                          if (dVar205 <= dVar190) {
                            dVar190 = dVar205;
                          }
                          if (dVar190 <= dVar202) {
                            dVar202 = dVar190;
                          }
                          uVar194 = -(ulong)(0.0 < dVar188 * dVar192) & (ulong)dVar202;
                          local_ab8 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                              uVar184 & uVar194);
                        }
                        local_ae8 = (dVar203 * dVar198 +
                                    (dVar200 * (dVar211 * dVar187 - dVar201 * dVar213) -
                                    dVar207 * dVar209)) / local_ae8;
                        if (((dVar189 == 1.0) && (!NAN(dVar189))) &&
                           ((dVar206 == 1.0 &&
                            (((!NAN(dVar206) && (pdVar53[lVar100 + lVar120 + lVar126] == 1.0)) &&
                             (!NAN(pdVar53[lVar100 + lVar120 + lVar126]))))))) {
                          dVar209 = dVar204 - pdVar38[lVar105 + lVar109 + lVar132 + lVar117];
                          dVar200 = (dVar186 - dVar204) + (dVar186 - dVar204);
                          dVar209 = dVar209 + dVar209;
                          dVar190 = (dVar186 - pdVar38[lVar105 + lVar109 + lVar132 + lVar117]) * 0.5
                          ;
                          dVar211 = ABS(dVar209);
                          uVar184 = -(ulong)(0.0 < dVar190);
                          dVar190 = ABS(dVar190);
                          dVar202 = ABS(dVar200);
                          if (dVar211 <= dVar190) {
                            dVar190 = dVar211;
                          }
                          if (dVar190 <= dVar202) {
                            dVar202 = dVar190;
                          }
                          uVar194 = -(ulong)(0.0 < dVar209 * dVar200) & (ulong)dVar202;
                          local_ae8 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                              uVar184 & uVar194);
                        }
                        dVar190 = dVar204;
                        if (dVar186 <= dVar204) {
                          dVar190 = dVar186;
                        }
                        dVar191 = dVar191 - dVar210;
                        dVar202 = dVar204;
                        if (dVar204 <= dVar186) {
                          dVar202 = dVar186;
                        }
                        dVar196 = dVar196 - dVar199;
                        iVar144 = 0;
                        iVar123 = 0;
                        iVar180 = 0;
                        iVar92 = 0;
                        uVar147 = 0xffffffff;
                        do {
                          uVar114 = uVar147 + 1;
                          uVar155 = 0xffffffff;
                          iVar174 = iVar144;
                          do {
                            uVar1 = uVar155 + 1;
                            iVar115 = 5;
                            do {
                              if (((uVar32 >> (iVar174 + iVar115 & 0x1fU) & 1) != 0) &&
                                 ((iVar115 != 6 || uVar155 != 0) || uVar147 != 0)) {
                                iVar123 = iVar123 + (uint)((iVar115 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar155 == 0 && uVar147 == 0));
                                iVar180 = iVar180 + (uint)((iVar115 == 6 && uVar147 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar92 = iVar92 + (uint)((iVar115 == 6 && uVar155 == 0) &&
                                                        (uVar114 & 0xfffffffd) == 0);
                              }
                              iVar115 = iVar115 + 1;
                            } while (iVar115 != 8);
                            iVar174 = iVar174 + 3;
                            uVar155 = uVar1;
                          } while (uVar1 != 2);
                          iVar144 = iVar144 + 9;
                          uVar147 = uVar114;
                        } while (uVar114 != 2);
                        dVar186 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar107 = -1;
                          cVar85 = '\b';
                          dVar200 = dVar204;
                          dVar186 = dVar204;
                          do {
                            lVar109 = 0;
                            cVar152 = cVar85;
                            do {
                              lVar121 = 0;
                              dVar209 = dVar186;
                              do {
                                dVar186 = dVar209;
                                if (((int)lVar121 != 1 || ((int)lVar109 != 0 || (int)lVar107 != 0))
                                   && ((1 << (cVar152 + (char)lVar121 & 0x1fU) & uVar32) != 0)) {
                                  dVar211 = pdVar38[lVar117 + (iVar90 + (int)lVar107) * lVar37 +
                                                              (iVar91 + (int)lVar109) * lVar36 +
                                                              (long)(int)(uVar5 + (int)lVar121)];
                                  dVar186 = dVar211;
                                  if (dVar211 <= dVar209) {
                                    dVar186 = dVar209;
                                  }
                                  if (dVar211 < dVar200) {
                                    dVar200 = dVar211;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                                dVar209 = dVar186;
                              } while (lVar121 != 3);
                              cVar152 = cVar152 + '\x03';
                              bVar183 = lVar109 == 0;
                              lVar109 = lVar109 + 1;
                            } while (bVar183);
                            lVar107 = lVar107 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar107 != 2);
                          dVar209 = (((pdVar45 + lVar139 + lVar97 + (lVar157 - lVar160))[lVar48] -
                                     dVar195) * local_ae8 +
                                    (0.5 - dVar210) * local_ab8 +
                                    (pdVar45[lVar139 + lVar97 + (lVar157 - lVar160)] - dVar199) *
                                    local_a28 + dVar204) - dVar204;
                          if (dVar209 <= 1e-13) {
                            dVar186 = 1.0;
                            if ((dVar209 < -1e-13) &&
                               (dVar186 = (dVar200 - dVar204) / dVar209, 1.0 <= dVar186)) {
                              dVar186 = 1.0;
                            }
                          }
                          else {
                            dVar186 = (dVar186 - dVar204) / dVar209;
                            if (1.0 <= dVar186) {
                              dVar186 = 1.0;
                            }
                          }
                          if (2.0 <= dVar186) {
                            dVar186 = 2.0;
                          }
                        }
                        dVar200 = dVar186;
                        if ((short)uVar32 < 0) {
                          lVar107 = -1;
                          cVar85 = '\x05';
                          pdVar110 = local_7a8;
                          dVar200 = dVar204;
                          dVar209 = dVar204;
                          do {
                            pdVar170 = pdVar110;
                            lVar109 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar121 = -1;
                              dVar211 = dVar200;
                              do {
                                dVar200 = dVar211;
                                if ((((int)lVar109 != 0 || (int)lVar107 != 0) || (int)lVar121 != 0)
                                   && ((1 << (cVar152 + (char)lVar121 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar201 = pdVar170[lVar121];
                                  dVar200 = dVar201;
                                  if (dVar201 <= dVar211) {
                                    dVar200 = dVar211;
                                  }
                                  if (dVar201 < dVar209) {
                                    dVar209 = dVar201;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                                dVar211 = dVar200;
                              } while (lVar121 != 2);
                              pdVar170 = pdVar170 + lVar36;
                              cVar152 = cVar152 + '\x03';
                              bVar183 = lVar109 != 0;
                              lVar109 = lVar109 + 1;
                            } while (bVar183);
                            lVar107 = lVar107 + 1;
                            pdVar110 = pdVar110 + lVar37;
                            cVar85 = cVar85 + '\t';
                          } while (lVar107 != 2);
                          dVar211 = (((pdVar45 + lVar150 + lVar97 + (lVar157 - lVar160))[lVar48] -
                                     dVar195) * local_ae8 +
                                    (((pdVar45[lVar150 + lVar97 + (lVar157 - lVar160)] - dVar199) *
                                      local_a28 + dVar204) - (dVar210 + 0.5) * local_ab8)) - dVar204
                          ;
                          if (dVar211 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar200 = (dVar209 - dVar204) / dVar211, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar204) / dVar211;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar186 <= dVar200) {
                            dVar200 = dVar186;
                          }
                        }
                        dVar186 = dVar200;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar107 = -1;
                          cVar85 = '\x06';
                          dVar209 = dVar204;
                          dVar186 = dVar204;
                          do {
                            lVar109 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar121 = 0;
                              do {
                                if ((((int)lVar109 != 0 || (int)lVar107 != 0) || (int)lVar121 != 0)
                                   && ((1 << (cVar152 + (char)lVar121 & 0x1fU) & uVar32) != 0)) {
                                  dVar211 = pdVar38[lVar117 + (iVar90 + (int)lVar107) * lVar37 +
                                                              (iVar91 + (int)lVar109) * lVar36 +
                                                              (long)(iVar143 + (int)lVar121)];
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar186) {
                                    dVar201 = dVar186;
                                  }
                                  dVar186 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 == 1);
                              lVar109 = lVar109 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar109 != 2);
                            lVar107 = lVar107 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar107 != 2);
                          dVar211 = (((pdVar49 + lVar163 + lVar98 + ((iVar113 - iVar15) + 1))
                                      [lVar52] - dVar195) * local_ae8 +
                                    (pdVar49[lVar163 + lVar98 + ((iVar113 - iVar15) + 1)] - dVar210)
                                    * local_ab8 + (0.5 - dVar199) * local_a28 + dVar204) - dVar204;
                          if (dVar211 <= 1e-13) {
                            dVar186 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar186 = (dVar209 - dVar204) / dVar211, 1.0 <= dVar186)) {
                              dVar186 = 1.0;
                            }
                          }
                          else {
                            dVar186 = (dVar186 - dVar204) / dVar211;
                            if (1.0 <= dVar186) {
                              dVar186 = 1.0;
                            }
                          }
                          if (dVar200 <= dVar186) {
                            dVar186 = dVar200;
                          }
                        }
                        dVar200 = dVar186;
                        if ((uVar32 >> 0x11 & 1) != 0) {
                          lVar107 = -1;
                          cVar85 = '\x05';
                          dVar209 = dVar204;
                          dVar200 = dVar204;
                          do {
                            lVar109 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar121 = -1;
                              do {
                                if ((((int)lVar109 != 0 || (int)lVar107 != 0) || (int)lVar121 != 0)
                                   && ((1 << (cVar152 + (char)lVar121 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = pdVar38[lVar117 + (iVar90 + (int)lVar107) * lVar37 +
                                                              (iVar91 + (int)lVar109) * lVar36 +
                                                              (long)(iVar143 + (int)lVar121)];
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar200) {
                                    dVar201 = dVar200;
                                  }
                                  dVar200 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 1);
                              lVar109 = lVar109 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar109 != 2);
                            lVar107 = lVar107 + 1;
                            cVar85 = cVar85 + '\t';
                          } while (lVar107 != 2);
                          dVar211 = (((pdVar49 + lVar163 + lVar98 + (lVar157 - iVar15))[lVar52] -
                                     dVar195) * local_ae8 +
                                    (pdVar49[lVar163 + lVar98 + (lVar157 - iVar15)] - dVar210) *
                                    local_ab8 + (dVar204 - (dVar199 + 0.5) * local_a28)) - dVar204;
                          if (dVar211 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar200 = (dVar209 - dVar204) / dVar211, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar204) / dVar211;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar186 <= dVar200) {
                            dVar200 = dVar186;
                          }
                        }
                        dVar186 = dVar200;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          cVar85 = '\x0e';
                          lVar107 = 0;
                          dVar209 = dVar204;
                          dVar186 = dVar204;
                          do {
                            lVar109 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar121 = -1;
                              do {
                                if ((((int)lVar109 != 0 || (int)lVar107 != 0) || (int)lVar121 != 0)
                                   && ((1 << (cVar152 + (char)lVar121 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = pdVar38[lVar117 + (iVar90 + (int)lVar107) * lVar37 +
                                                              (iVar91 + (int)lVar109) * lVar36 +
                                                              (long)(iVar143 + (int)lVar121)];
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar186) {
                                    dVar201 = dVar186;
                                  }
                                  dVar186 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 2);
                              lVar109 = lVar109 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar109 != 2);
                            cVar85 = cVar85 + '\t';
                            bVar183 = lVar107 == 0;
                            lVar107 = lVar107 + 1;
                          } while (bVar183);
                          dVar211 = ((0.5 - dVar195) * local_ae8 +
                                    dVar191 * local_ab8 + dVar196 * local_a28 + dVar204) - dVar204;
                          if (dVar211 <= 1e-13) {
                            dVar186 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar186 = (dVar209 - dVar204) / dVar211, 1.0 <= dVar186)) {
                              dVar186 = 1.0;
                            }
                          }
                          else {
                            dVar186 = (dVar186 - dVar204) / dVar211;
                            if (1.0 <= dVar186) {
                              dVar186 = 1.0;
                            }
                          }
                          if (dVar200 <= dVar186) {
                            dVar186 = dVar200;
                          }
                        }
                        dVar200 = dVar186;
                        if ((uVar32 >> 9 & 1) != 0) {
                          cVar85 = '\x05';
                          lVar107 = -1;
                          dVar209 = dVar204;
                          dVar200 = dVar204;
                          do {
                            lVar109 = -1;
                            cVar152 = cVar85;
                            do {
                              lVar121 = -1;
                              do {
                                if ((((int)lVar109 != 0 || (int)lVar107 != 0) || (int)lVar121 != 0)
                                   && ((1 << (cVar152 + (char)lVar121 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar211 = pdVar38[lVar117 + (iVar90 + (int)lVar107) * lVar37 +
                                                              (iVar91 + (int)lVar109) * lVar36 +
                                                              (long)(iVar143 + (int)lVar121)];
                                  dVar201 = dVar211;
                                  if (dVar211 <= dVar200) {
                                    dVar201 = dVar200;
                                  }
                                  dVar200 = dVar201;
                                  if (dVar211 < dVar209) {
                                    dVar209 = dVar211;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 2);
                              lVar109 = lVar109 + 1;
                              cVar152 = cVar152 + '\x03';
                            } while (lVar109 != 2);
                            cVar85 = cVar85 + '\t';
                            bVar183 = lVar107 != 0;
                            lVar107 = lVar107 + 1;
                          } while (bVar183);
                          dVar199 = ((((pdVar41 + lVar103 + lVar108 + (lVar2 - iVar12) * lVar43)
                                       [lVar44] - dVar210) * local_ab8 +
                                     (pdVar41[lVar103 + lVar108 + (lVar2 - iVar12) * lVar43] -
                                     dVar199) * local_a28 + dVar204) - (dVar195 + 0.5) * local_ae8)
                                    - dVar204;
                          if (dVar199 <= 1e-13) {
                            dVar200 = 1.0;
                            if ((dVar199 < -1e-13) &&
                               (dVar200 = (dVar209 - dVar204) / dVar199, 1.0 <= dVar200)) {
                              dVar200 = 1.0;
                            }
                          }
                          else {
                            dVar200 = (dVar200 - dVar204) / dVar199;
                            if (1.0 <= dVar200) {
                              dVar200 = 1.0;
                            }
                          }
                          if (dVar186 <= dVar200) {
                            dVar200 = dVar186;
                          }
                        }
                        dVar199 = 0.0;
                        if (1 < iVar123) {
                          dVar199 = dVar200;
                        }
                        dVar210 = 0.0;
                        if (1 < iVar180) {
                          dVar210 = dVar200;
                        }
                        dVar186 = 0.0;
                        if (1 < iVar92) {
                          dVar186 = dVar200;
                        }
                        if ((((dVar189 == 1.0) && (!NAN(dVar189))) &&
                            (pdVar53[lVar100 + lVar125 + (int)(~uVar18 + iVar113)] == 1.0)) &&
                           (((!NAN(pdVar53[lVar100 + lVar125 + (int)(~uVar18 + iVar113)]) &&
                             (pdVar53[lVar100 + lVar125 + (int)((iVar113 - uVar18) + 1)] == 1.0)) &&
                            (!NAN(pdVar53[lVar100 + lVar125 + (int)((iVar113 - uVar18) + 1)]))))) {
                          dVar199 = 1.0;
                        }
                        if (((dVar189 == 1.0) && (!NAN(dVar189))) &&
                           ((pdVar53[lVar140 + lVar125 + lVar120] == 1.0 &&
                            (((!NAN(pdVar53[lVar140 + lVar125 + lVar120]) &&
                              (pdVar53[lVar168 + lVar125 + lVar120] == 1.0)) &&
                             (!NAN(pdVar53[lVar168 + lVar125 + lVar120]))))))) {
                          dVar210 = 1.0;
                        }
                        if (((dVar189 == 1.0) && (!NAN(dVar189))) &&
                           (((dVar206 == 1.0 &&
                             ((!NAN(dVar206) &&
                              (pdVar53[lVar100 + lVar120 + ((iVar112 - iVar17) + -2) * lVar55] ==
                               1.0)))) &&
                            (!NAN(pdVar53[lVar100 + lVar120 + ((iVar112 - iVar17) + -2) * lVar55])))
                           )) {
                          dVar186 = 1.0;
                        }
                        dVar206 = (0.5 - dVar195) * local_ae8 * dVar186 +
                                  dVar191 * local_ab8 * dVar210 +
                                  dVar196 * local_a28 * dVar199 + dVar204;
                        if (dVar206 <= dVar202) {
                          dVar202 = dVar206;
                        }
                        if (dVar190 <= dVar202) {
                          dVar190 = dVar202;
                        }
                        dVar190 = pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] * dVar185 * -0.5
                                  * local_ae8 * dVar186 + dVar190;
                        auVar214 = _DAT_006979b0;
                      }
                      else {
                        dVar190 = pdVar53[lVar100 + lVar120 + ((int)lVar3 - iVar17) * lVar55];
                        if (((dVar190 != 1.0) ||
                            (((NAN(dVar190) || (dVar206 != 1.0)) || (NAN(dVar206))))) ||
                           ((((pdVar53[lVar100 + lVar120 + ((iVar112 + -3) - iVar17) * lVar55] !=
                               1.0 || (NAN(pdVar53[lVar100 + lVar120 + ((iVar112 + -3) - iVar17) *
                                                                       lVar55]))) ||
                             (pdVar53[lVar100 + lVar120 + ((int)lVar4 - iVar17) * lVar55] != 1.0))
                            || (NAN(pdVar53[lVar100 + lVar120 + ((int)lVar4 - iVar17) * lVar55])))))
                        {
                          if (((dVar206 != 1.0) || (NAN(dVar206))) ||
                             ((dVar190 != 1.0 || (NAN(dVar190))))) goto LAB_0035b806;
                          lVar107 = lVar157 - lVar175;
                          dVar190 = pdVar38[lVar101 + lVar107 + lVar130 + lVar117];
                          dVar196 = dVar190 - pdVar38[lVar101 + lVar107 + lVar95 + lVar117];
                          dVar191 = pdVar38[lVar101 + lVar107 + lVar128 + lVar117] - dVar190;
                          dVar196 = dVar196 + dVar196;
                          dVar191 = dVar191 + dVar191;
                          dVar206 = (pdVar38[lVar101 + lVar107 + lVar128 + lVar117] -
                                    pdVar38[lVar101 + lVar107 + lVar95 + lVar117]) * 0.5;
                          dVar195 = ABS(dVar196);
                          uVar184 = -(ulong)(0.0 < dVar206);
                          dVar206 = ABS(dVar206);
                          dVar189 = ABS(dVar191);
                          if (dVar195 <= dVar206) {
                            dVar206 = dVar195;
                          }
                          if (dVar206 <= dVar189) {
                            dVar189 = dVar206;
                          }
                          uVar194 = -(ulong)(0.0 < dVar196 * dVar191) & (ulong)dVar189;
                          dVar190 = (double)(~uVar184 & (uVar194 ^ 0x8000000000000000) |
                                            uVar184 & uVar194) *
                                    (1.0 - pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] *
                                           dVar185) * 0.5 + dVar190;
                        }
                        else {
                          lVar107 = lVar157 - lVar175;
                          dVar190 = pdVar38[lVar101 + lVar107 + lVar130 + lVar117];
                          dVar196 = dVar190 - pdVar38[lVar101 + lVar107 + lVar95 + lVar117];
                          dVar191 = pdVar38[lVar101 + lVar107 + lVar95 + lVar117] -
                                    pdVar38[lVar101 + lVar107 + ((iVar112 + -3) - iVar11) * lVar37 +
                                                                lVar117];
                          dVar189 = 0.0;
                          dVar206 = 0.0;
                          if (0.0 <= dVar196 * dVar191) {
                            dVar206 = ABS(dVar196);
                            if (ABS(dVar191) <= ABS(dVar196)) {
                              dVar206 = ABS(dVar191);
                            }
                            dVar206 = dVar206 + dVar206;
                          }
                          dVar195 = pdVar38[lVar101 + lVar107 + ((int)lVar4 - iVar11) * lVar37 +
                                                                lVar117] -
                                    pdVar38[lVar101 + lVar107 + lVar128 + lVar117];
                          dVar210 = pdVar38[lVar101 + lVar107 + lVar128 + lVar117] - dVar190;
                          dVar199 = (dVar210 + dVar195) * 0.5;
                          if (0.0 <= dVar210 * dVar195) {
                            dVar189 = ABS(dVar195);
                            if (ABS(dVar210) <= ABS(dVar195)) {
                              dVar189 = ABS(dVar210);
                            }
                            dVar189 = dVar189 + dVar189;
                          }
                          dVar186 = (dVar196 + dVar210) * 0.5;
                          dVar195 = 0.0;
                          if (0.0 <= dVar196 * dVar210) {
                            dVar195 = ABS(dVar210);
                            if (ABS(dVar196) <= ABS(dVar210)) {
                              dVar195 = ABS(dVar196);
                            }
                            dVar195 = dVar195 + dVar195;
                          }
                          dVar191 = (dVar196 + dVar191) * 0.5;
                          dVar196 = ABS(dVar191);
                          if (dVar206 <= dVar196) {
                            dVar196 = dVar206;
                          }
                          dVar206 = ABS(dVar199);
                          if (dVar189 <= dVar206) {
                            dVar206 = dVar189;
                          }
                          dVar206 = ABS(dVar186 * 1.3333333333333333 +
                                        (dVar206 * (double)((ulong)dVar199 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar196 * (double)((ulong)dVar191 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar195 <= dVar206) {
                            dVar206 = dVar195;
                          }
                          dVar190 = dVar206 * (double)((ulong)dVar186 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar67[lVar102 + lVar129 + (lVar157 - lVar177)] *
                                           dVar185) * 0.5 + dVar190;
                        }
                      }
                    }
                    pdVar59[local_938 * lVar62 +
                            (int)(iVar112 + ~uVar21) * lVar61 +
                            (local_920 - iVar22) * lVar60 + (lVar157 - iVar23)] = dVar190;
                    pdVar63[local_938 * lVar66 +
                            (local_930 - iVar24) * lVar65 +
                            (local_920 - iVar25) * lVar64 + (lVar157 - iVar26)] = local_9e8;
                    lVar157 = lVar157 + 1;
                    local_7a0 = local_7a0 + 1;
                    local_798 = local_798 + 1;
                    pdVar151 = pdVar151 + 1;
                    local_aa0 = local_aa0 + 0x100000000;
                    local_778 = local_778 + 0x100000000;
                    iVar83 = iVar83 + 1;
                    uVar5 = uVar5 + 1;
                    local_7a8 = local_7a8 + 1;
                    iVar143 = iVar143 + 1;
                  } while (iVar30 + 1 != (int)lVar157);
                }
                local_920 = local_920 + 1;
                local_830 = local_830 + lVar33;
                local_828 = local_828 + lVar33;
                local_820 = local_820 + lVar33;
                local_918 = local_918 + lVar36;
              } while (iVar31 + 1 != (int)local_920);
            }
            local_930 = local_930 + 1;
            local_860 = local_860 + lVar34;
            local_858 = local_858 + lVar34;
            local_850 = local_850 + lVar34;
            local_928 = local_928 + lVar37;
          } while (iVar29 + 1 != (int)local_930);
        }
        local_938 = local_938 + 1;
        local_888 = local_888 + lVar39;
      } while (local_938 != (uint)ncomp);
    }
  }
  else {
    local_3b8.q.p = q->p;
    local_3b8.q.jstride = q->jstride;
    local_3b8.q.kstride = q->kstride;
    local_3b8.q.nstride = q->nstride;
    local_3b8.q.begin.x = (q->begin).x;
    local_3b8.q.begin.y = (q->begin).y;
    uVar70 = *(undefined8 *)&(q->begin).z;
    uVar71 = (q->end).y;
    local_3b8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_3b8.q.begin.z = (int)uVar70;
    local_3b8.q.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.wmac.p = wmac->p;
    local_3b8.wmac.jstride = wmac->jstride;
    local_3b8.wmac.kstride = wmac->kstride;
    local_3b8.wmac.nstride = wmac->nstride;
    local_3b8.wmac.begin.x = (wmac->begin).x;
    local_3b8.wmac.begin.y = (wmac->begin).y;
    uVar72 = (wmac->end).x;
    uVar73 = (wmac->end).y;
    local_3b8.wmac._52_8_ = *(undefined8 *)&(wmac->end).z;
    local_3b8.wmac.begin.z = (int)*(undefined8 *)&(wmac->begin).z;
    local_3b8.Imz.p = Imz->p;
    local_3b8.Imz.jstride = Imz->jstride;
    local_3b8.Imz.kstride = Imz->kstride;
    local_3b8.Imz.nstride = Imz->nstride;
    local_3b8.Imz.begin.x = (Imz->begin).x;
    local_3b8.Imz.begin.y = (Imz->begin).y;
    uVar70 = *(undefined8 *)&(Imz->begin).z;
    uVar74 = (Imz->end).y;
    local_3b8.Imz._52_8_ = *(undefined8 *)&(Imz->end).z;
    local_3b8.Imz.begin.z = (int)uVar70;
    local_3b8.Imz.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.Ipz.p = Ipz->p;
    local_3b8.Ipz.jstride = Ipz->jstride;
    local_3b8.Ipz.kstride = Ipz->kstride;
    local_3b8.Ipz.nstride = Ipz->nstride;
    local_3b8.Ipz.begin.x = (Ipz->begin).x;
    local_3b8.Ipz.begin.y = (Ipz->begin).y;
    uVar75 = (Ipz->end).x;
    uVar76 = (Ipz->end).y;
    local_3b8.Ipz._52_8_ = *(undefined8 *)&(Ipz->end).z;
    local_3b8.Ipz.begin.z = (int)*(undefined8 *)&(Ipz->begin).z;
    local_3b8.pbc = pbc;
    local_3b8.flag.p = flag->p;
    local_3b8.flag.jstride = flag->jstride;
    local_3b8.flag.kstride = flag->kstride;
    local_3b8.flag.nstride = flag->nstride;
    local_3b8.flag.begin.x = (flag->begin).x;
    local_3b8.flag.begin.y = (flag->begin).y;
    uVar70 = *(undefined8 *)&(flag->begin).z;
    uVar77 = (flag->end).y;
    local_3b8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_3b8.flag.begin.z = (int)uVar70;
    local_3b8.flag.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.vfrac.p = vfrac->p;
    local_3b8.vfrac.jstride = vfrac->jstride;
    local_3b8.vfrac.kstride = vfrac->kstride;
    local_3b8.vfrac.nstride = vfrac->nstride;
    local_3b8.vfrac.begin.x = (vfrac->begin).x;
    local_3b8.vfrac.begin.y = (vfrac->begin).y;
    uVar70 = *(undefined8 *)&(vfrac->begin).z;
    uVar78 = (vfrac->end).y;
    local_3b8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_3b8.vfrac.begin.z = (int)uVar70;
    local_3b8.vfrac.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.ccc.p = ccc->p;
    local_3b8.ccc.jstride = ccc->jstride;
    local_3b8.ccc.kstride = ccc->kstride;
    local_3b8.ccc.nstride = ccc->nstride;
    local_3b8.ccc.begin.x = (ccc->begin).x;
    local_3b8.ccc.begin.y = (ccc->begin).y;
    uVar70 = *(undefined8 *)&(ccc->begin).z;
    uVar79 = (ccc->end).y;
    local_3b8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_3b8.ccc.begin.z = (int)uVar70;
    local_3b8.ccc.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcx.p = fcx->p;
    local_3b8.fcx.jstride = fcx->jstride;
    local_3b8.fcx.kstride = fcx->kstride;
    local_3b8.fcx.nstride = fcx->nstride;
    local_3b8.fcx.begin.x = (fcx->begin).x;
    local_3b8.fcx.begin.y = (fcx->begin).y;
    uVar70 = *(undefined8 *)&(fcx->begin).z;
    uVar80 = (fcx->end).y;
    local_3b8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_3b8.fcx.begin.z = (int)uVar70;
    local_3b8.fcx.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcy.p = fcy->p;
    local_3b8.fcy.jstride = fcy->jstride;
    local_3b8.fcy.kstride = fcy->kstride;
    local_3b8.fcy.nstride = fcy->nstride;
    local_3b8.fcy.begin.x = (fcy->begin).x;
    local_3b8.fcy.begin.y = (fcy->begin).y;
    uVar70 = *(undefined8 *)&(fcy->begin).z;
    uVar81 = (fcy->end).y;
    local_3b8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_3b8.fcy.begin.z = (int)uVar70;
    local_3b8.fcy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcz.p = fcz->p;
    local_3b8.fcz.jstride = fcz->jstride;
    local_3b8.fcz.kstride = fcz->kstride;
    local_3b8.fcz.nstride = fcz->nstride;
    local_3b8.fcz.begin.x = (fcz->begin).x;
    local_3b8.fcz.begin.y = (fcz->begin).y;
    uVar70 = *(undefined8 *)&(fcz->begin).z;
    uVar82 = (fcz->end).y;
    local_3b8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_3b8.fcz.begin.z = (int)uVar70;
    local_3b8.fcz.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.is_velocity = is_velocity;
    if (0 < ncomp) {
      iVar9 = (zebox->smallend).vect[0];
      iVar10 = (zebox->smallend).vect[1];
      iVar11 = (zebox->smallend).vect[2];
      iVar12 = (zebox->bigend).vect[2];
      iVar13 = (zebox->bigend).vect[0];
      iVar14 = (zebox->bigend).vect[1];
      iVar141 = 0;
      local_3b8.q.end.y = uVar71;
      local_3b8.wmac.end.x = uVar72;
      local_3b8.wmac.end.y = uVar73;
      local_3b8.domain_ilo = iVar182;
      local_3b8.domain_jlo = iVar173;
      local_3b8.domain_klo = iVar7;
      local_3b8.domain_ihi = iVar176;
      local_3b8.domain_jhi = iVar6;
      local_3b8.domain_khi = iVar8;
      local_3b8.Imz.end.y = uVar74;
      local_3b8.Ipz.end.x = uVar75;
      local_3b8.Ipz.end.y = uVar76;
      local_3b8.dtdz = dVar185;
      local_3b8.flag.end.y = uVar77;
      local_3b8.vfrac.end.y = uVar78;
      local_3b8.ccc.end.y = uVar79;
      local_3b8.fcx.end.y = uVar80;
      local_3b8.fcy.end.y = uVar81;
      local_3b8.fcz.end.y = uVar82;
      do {
        iVar182 = iVar11;
        if (iVar11 <= iVar12) {
          do {
            iVar173 = iVar10;
            if (iVar10 <= iVar14) {
              do {
                iVar176 = iVar9;
                if (iVar9 <= iVar13) {
                  do {
                    PredictStateOnZFace::anon_class_688_19_da5fa63c::operator()
                              (&local_3b8,iVar176,iVar173,iVar182,iVar141);
                    iVar176 = iVar176 + 1;
                  } while (iVar13 + 1 != iVar176);
                }
                bVar183 = iVar173 != iVar14;
                iVar173 = iVar173 + 1;
              } while (bVar183);
            }
            bVar183 = iVar182 != iVar12;
            iVar182 = iVar182 + 1;
          } while (bVar183);
        }
        iVar141 = iVar141 + 1;
      } while (iVar141 != ncomp);
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnZFace ( Box const& zebox, int ncomp,
                             Array4<Real> const& Imz, Array4<Real> const& Ipz,
                             Array4<Real const> const& q,
                             Array4<Real const> const& wmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dz = geom.CellSize(1);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qpls = q(i,j,k-1,n);

                // Over-write all with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    qmns = q(i,j,k-1,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qmns = q(i,j,k,n);
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dt,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}